

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

void __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<4>::rehash
          (InnerLeaf<4> *this,int hashPos)

{
  long lVar1;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *pHVar2;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *pHVar3;
  int iVar4;
  unsigned_long uVar5;
  double dVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *paVar16;
  uint64_t hash;
  ulong uVar17;
  int i;
  type entry;
  int local_50;
  int local_4c;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  (this->occupation).occupation = 0;
  iVar4 = this->size;
  if (0 < (long)iVar4) {
    uVar14 = (this->occupation).occupation;
    paVar16 = &this->entries;
    lVar15 = 0;
    do {
      uVar17 = (ulong)(uint)paVar16->_M_elems[0].key_;
      uVar17 = (uVar17 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
               uVar17 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32) >>
               ((char)hashPos * -6 + 0x30U & 0x3f);
      (this->hashes)._M_elems[lVar15] = uVar17 & 0xffff;
      uVar14 = uVar14 | 1L << (uVar17 >> 10 & 0x3f);
      lVar15 = lVar15 + 1;
      paVar16 = (array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_54UL> *)
                (paVar16->_M_elems + 1);
    } while (iVar4 != lVar15);
    (this->occupation).occupation = uVar14;
  }
  local_4c = 0;
  if (0 < this->size) {
    do {
      lVar15 = (long)local_4c;
      uVar14 = (this->hashes)._M_elems[lVar15];
      local_50 = (int)POPCOUNT((this->occupation).occupation >> ((byte)(uVar14 >> 10) & 0x3f)) + -1;
      if (local_4c < local_50) {
        uVar5 = (this->hashes)._M_elems[local_50];
        (this->hashes)._M_elems[local_50] = uVar14;
        (this->hashes)._M_elems[lVar15] = uVar5;
        dVar6 = (this->entries)._M_elems[local_50].value_.constant;
        pHVar2 = (this->entries)._M_elems + local_50;
        iVar4 = pHVar2->key_;
        uVar12 = *(undefined4 *)&pHVar2->field_0x4;
        dVar8 = (pHVar2->value_).coef;
        (this->entries)._M_elems[local_50].value_.constant =
             (this->entries)._M_elems[lVar15].value_.constant;
        pHVar2 = (this->entries)._M_elems + lVar15;
        uVar11 = *(undefined4 *)&pHVar2->field_0x4;
        dVar9 = (pHVar2->value_).coef;
        pHVar3 = (this->entries)._M_elems + local_50;
        pHVar3->key_ = pHVar2->key_;
        *(undefined4 *)&pHVar3->field_0x4 = uVar11;
        (pHVar3->value_).coef = dVar9;
        (this->entries)._M_elems[lVar15].value_.constant = dVar6;
        pHVar2 = (this->entries)._M_elems + lVar15;
        pHVar2->key_ = iVar4;
        *(undefined4 *)&pHVar2->field_0x4 = uVar12;
        (pHVar2->value_).coef = dVar8;
      }
      else {
        bVar7 = local_50 < local_4c;
        if (local_50 < local_4c) {
          if (uVar14 <= (this->hashes)._M_elems[local_50]) {
            lVar13 = (long)local_50;
            do {
              if (local_4c + -1 == (int)lVar13) goto LAB_002aca2e;
              lVar1 = lVar13 + 1;
              lVar10 = lVar13 + 1;
              lVar13 = lVar1;
            } while (uVar14 <= (this->hashes)._M_elems[lVar10]);
            local_50 = (int)lVar1;
            bVar7 = lVar1 < lVar15;
          }
          if (bVar7) {
            local_38 = (this->entries)._M_elems[lVar15].value_.constant;
            pHVar2 = (this->entries)._M_elems + lVar15;
            local_48 = *(undefined8 *)pHVar2;
            dStack_40 = (pHVar2->value_).coef;
            move_backward(this,&local_50,&local_4c);
            lVar15 = (long)local_50;
            (this->hashes)._M_elems[lVar15] = uVar14;
            (this->entries)._M_elems[lVar15].value_.constant = local_38;
            pHVar2 = (this->entries)._M_elems + lVar15;
            *(undefined8 *)pHVar2 = local_48;
            (pHVar2->value_).coef = dStack_40;
          }
        }
LAB_002aca2e:
        local_4c = local_4c + 1;
      }
    } while (local_4c < this->size);
  }
  return;
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }